

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O0

void pbrt::InitLogging(LogLevel level,bool useGPU)

{
  int in_EDI;
  char *in_stack_00000030;
  
  LOGGING_LogLevel = in_EDI;
  if (in_EDI == 3) {
    ErrorExit<>(in_stack_00000030);
  }
  return;
}

Assistant:

void InitLogging(LogLevel level, bool useGPU) {
    LOGGING_LogLevel = level;

    if (level == LogLevel::Invalid)
        ErrorExit("Invalid --log-level specified.");

#ifdef PBRT_BUILD_GPU_RENDERER
    if (useGPU)
        CUDA_CHECK(cudaMemcpyToSymbol(LOGGING_LogLevelGPU, &LOGGING_LogLevel,
                                      sizeof(LOGGING_LogLevel)));
#endif
}